

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flag.cc
# Opt level: O3

unique_ptr<void,_absl::lts_20240722::flags_internal::DynValueDeleter> __thiscall
absl::lts_20240722::flags_internal::FlagImpl::MakeInitValue(FlagImpl *this)

{
  code *pcVar1;
  char *pcVar2;
  _Head_base<0UL,_void_*,_false> extraout_RDX;
  long in_RSI;
  long lVar3;
  unique_ptr<void,_absl::lts_20240722::flags_internal::DynValueDeleter> uVar4;
  
  pcVar1 = *(code **)(in_RSI + 0x18);
  if ((*(byte *)(in_RSI + 0x29) & 3) == 1) {
    pcVar2 = (char *)(*pcVar1)(0,0,0,0);
    (**(code **)(in_RSI + 0x40))(pcVar2);
  }
  else {
    if ((*(byte *)(in_RSI + 0x29) & 3) == 0) {
      lVar3 = *(long *)(in_RSI + 0x40);
    }
    else {
      lVar3 = in_RSI + 0x40;
    }
    pcVar2 = (char *)(*pcVar1)(0,0,0,0);
    (*pcVar1)(3,lVar3,pcVar2,0);
  }
  DynValueDeleter::DynValueDeleter((DynValueDeleter *)this,*(FlagOpFn *)(in_RSI + 0x18));
  this->name_ = pcVar2;
  uVar4._M_t.super___uniq_ptr_impl<void,_absl::lts_20240722::flags_internal::DynValueDeleter>._M_t.
  super__Tuple_impl<0UL,_void_*,_absl::lts_20240722::flags_internal::DynValueDeleter>.
  super__Head_base<0UL,_void_*,_false>._M_head_impl = extraout_RDX._M_head_impl;
  uVar4._M_t.super___uniq_ptr_impl<void,_absl::lts_20240722::flags_internal::DynValueDeleter>._M_t.
  super__Tuple_impl<0UL,_void_*,_absl::lts_20240722::flags_internal::DynValueDeleter>.
  super__Tuple_impl<1UL,_absl::lts_20240722::flags_internal::DynValueDeleter>.
  super__Head_base<1UL,_absl::lts_20240722::flags_internal::DynValueDeleter,_false>._M_head_impl.op
       = (_Head_base<1UL,_absl::lts_20240722::flags_internal::DynValueDeleter,_false>)
         (_Head_base<1UL,_absl::lts_20240722::flags_internal::DynValueDeleter,_false>)this;
  return (unique_ptr<void,_absl::lts_20240722::flags_internal::DynValueDeleter>)
         uVar4._M_t.super___uniq_ptr_impl<void,_absl::lts_20240722::flags_internal::DynValueDeleter>
         ._M_t.super__Tuple_impl<0UL,_void_*,_absl::lts_20240722::flags_internal::DynValueDeleter>;
}

Assistant:

std::unique_ptr<void, DynValueDeleter> FlagImpl::MakeInitValue() const {
  void* res = nullptr;
  switch (DefaultKind()) {
    case FlagDefaultKind::kDynamicValue:
      res = flags_internal::Clone(op_, default_value_.dynamic_value);
      break;
    case FlagDefaultKind::kGenFunc:
      res = flags_internal::Alloc(op_);
      (*default_value_.gen_func)(res);
      break;
    default:
      res = flags_internal::Clone(op_, &default_value_);
      break;
  }
  return {res, DynValueDeleter{op_}};
}